

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub.c
# Opt level: O1

int IoTHub_Init(void)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x11;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub.c"
                ,"IoTHub_Init",0x10,1,"Platform initialization failed");
    }
  }
  return iVar1;
}

Assistant:

int IoTHub_Init(void)
{
    int result;
    if (platform_init() != 0)
    {
        LogError("Platform initialization failed");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }
    return result;
}